

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

char * __thiscall
despot::util::tinyxml::TiXmlElement::Attribute(TiXmlElement *this,char *name,double *d)

{
  int iVar1;
  TiXmlAttribute *pTVar2;
  char *__nptr;
  double dVar3;
  
  pTVar2 = &(this->attributeSet).sentinel;
  do {
    pTVar2 = pTVar2->next;
    if (pTVar2 == &(this->attributeSet).sentinel) {
      pTVar2 = (TiXmlAttribute *)0x0;
      break;
    }
    iVar1 = strcmp(((pTVar2->name).rep_)->str,name);
  } while (iVar1 != 0);
  if (pTVar2 == (TiXmlAttribute *)0x0) {
    __nptr = (char *)0x0;
  }
  else {
    __nptr = ((pTVar2->value).rep_)->str;
  }
  if (d != (double *)0x0) {
    if (__nptr == (char *)0x0) {
      dVar3 = 0.0;
    }
    else {
      dVar3 = atof(__nptr);
    }
    *d = dVar3;
  }
  return __nptr;
}

Assistant:

const char* TiXmlElement::Attribute(const char* name, double* d) const {
	const char* s = Attribute(name);
	if (d) {
		if (s) {
			*d = atof(s);
		} else {
			*d = 0;
		}
	}
	return s;
}